

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture2DArrayView *src,float *texCoord,ReferenceParams *params)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ulong uVar12;
  int y;
  int y_00;
  int x;
  int x_00;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 extraout_XMM0 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  Texture2DArrayView TVar34;
  Vector<float,_4> VVar35;
  Vec3 triR [2];
  Texture2DArrayView src_1;
  Vec3 triT [2];
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  float local_128;
  undefined4 uStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118 [6];
  Sampler *local_100;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  IVec2 local_e0;
  undefined1 local_d8 [16];
  Vec3 local_c8;
  undefined1 local_bc [20];
  Vec3 local_a8;
  Vec3 local_9c;
  ulong local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  pointer local_68;
  IVec2 local_58;
  tcu local_50 [16];
  tcu local_40 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  fVar33 = *texCoord;
  fVar17 = texCoord[1];
  fVar18 = texCoord[3];
  fVar22 = texCoord[6];
  fVar30 = texCoord[9];
  fVar1 = texCoord[4];
  fVar2 = texCoord[7];
  fVar3 = texCoord[10];
  fVar4 = texCoord[2];
  fVar5 = texCoord[5];
  fVar6 = texCoord[8];
  fVar7 = texCoord[0xb];
  local_78 = ZEXT416(0);
  local_68 = (pointer)0x0;
  local_100 = &params->sampler;
  TVar34 = tcu::getEffectiveTextureView
                     (src,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           *)local_78,local_100);
  local_d8._8_8_ = TVar34.m_levels;
  local_d8._0_4_ = TVar34.m_numLevels;
  local_88 = 0;
  if (((params->super_RenderParams).flags & 2) != 0) {
    local_88 = (ulong)(uint)(params->super_RenderParams).bias;
  }
  uStack_80 = 0;
  local_e0.m_data[0] = dst->m_width;
  local_e0.m_data[1] = dst->m_height;
  if ((int)local_d8._0_4_ < 1) {
    local_58.m_data[0] = 0;
    local_58.m_data[1] = 0;
  }
  else {
    local_58.m_data = *(int (*) [2])(((ConstPixelBufferAccess *)local_d8._8_8_)->m_size).m_data;
  }
  local_118[0] = fVar4;
  local_118[1] = fVar5;
  local_118[2] = fVar6;
  local_118[3] = fVar7;
  local_118[4] = fVar6;
  local_118[5] = fVar5;
  local_c8.m_data[0] = fVar17;
  local_c8.m_data[1] = fVar1;
  local_c8.m_data[2] = fVar2;
  local_bc._0_4_ = fVar3;
  local_bc._4_4_ = fVar2;
  local_bc._8_4_ = fVar1;
  local_a8.m_data[0] = fVar33;
  local_a8.m_data[1] = fVar18;
  local_a8.m_data[2] = fVar22;
  local_9c.m_data[0] = fVar30;
  local_9c.m_data[1] = fVar22;
  local_9c.m_data[2] = fVar18;
  fVar17 = computeNonProjectedTriLod(params->lodMode,&local_e0,&local_58,&local_a8,&local_c8);
  uVar9 = params->minLod;
  uVar10 = params->baseLevel;
  uVar11 = params->maxLevel;
  fVar33 = params->maxLod;
  fVar18 = computeNonProjectedTriLod(params->lodMode,&local_e0,&local_58,&local_9c,(Vec3 *)local_bc)
  ;
  auVar31._4_4_ = params->maxLod;
  auVar31._0_4_ = fVar33;
  auVar31._8_8_ = 0;
  auVar32._4_4_ = fVar18 + (float)local_88;
  auVar32._0_4_ = fVar17 + (float)local_88;
  auVar32._8_4_ = extraout_XMM0_Db + (float)local_88;
  auVar32._12_4_ = extraout_XMM0_Db_00 + (float)local_88;
  auVar32 = minps(auVar31,auVar32);
  uVar13 = -(uint)(fVar17 + (float)local_88 < (float)uVar9);
  uVar14 = -(uint)(fVar18 + (float)local_88 < params->minLod);
  uVar15 = -(uint)(extraout_XMM0_Db + (float)local_88 < (float)uVar10);
  uVar16 = -(uint)(extraout_XMM0_Db_00 + (float)local_88 < (float)uVar11);
  auVar19._0_4_ = uVar9 & uVar13;
  auVar19._4_4_ = (uint)params->minLod & uVar14;
  auVar19._8_4_ = uVar10 & uVar15;
  auVar19._12_4_ = uVar11 & uVar16;
  auVar23._0_4_ = ~uVar13 & auVar32._0_4_;
  auVar23._4_4_ = ~uVar14 & auVar32._4_4_;
  auVar23._8_4_ = ~uVar15 & auVar32._8_4_;
  auVar23._12_4_ = ~uVar16 & auVar32._12_4_;
  auVar24 = auVar23 | auVar19;
  local_e8 = auVar24._0_8_;
  y_00 = 0;
  do {
    if (dst->m_height <= y_00) {
      std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      ~_Vector_base((_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                     *)local_78);
      return;
    }
    auVar20._4_12_ = auVar19._4_12_;
    auVar20._0_4_ = (float)y_00 + 0.5;
    auVar32 = auVar20;
    for (x_00 = 0; x_00 < dst->m_width; x_00 = x_00 + 1) {
      auVar25._4_12_ = auVar24._4_12_;
      auVar25._0_4_ = (float)x_00 + 0.5;
      uStack_124 = auVar19._4_4_;
      auVar27._12_4_ = auVar24._12_4_;
      auVar27._0_8_ = auVar25._0_8_;
      auVar27._8_4_ = auVar24._4_4_;
      auVar26._8_8_ = auVar27._8_8_;
      auVar26._4_4_ = auVar20._0_4_;
      auVar26._0_4_ = auVar25._0_4_;
      auVar28._0_12_ = auVar26._0_12_;
      auVar28._12_4_ = uStack_124;
      auVar21._0_4_ = (float)dst->m_width;
      auVar21._4_4_ = (float)dst->m_height;
      auVar21._8_8_ = 0;
      auVar32 = divps(auVar28,auVar21);
      fVar33 = auVar32._4_4_;
      bVar8 = 1.0 <= auVar32._0_4_ + fVar33;
      if (bVar8) {
        auVar32 = ZEXT416((uint)(1.0 - auVar32._0_4_));
        if (!bVar8) goto LAB_01548465;
LAB_0154844e:
        fVar17 = auVar32._0_4_;
        fVar33 = 1.0 - fVar33;
      }
      else {
        if (bVar8) goto LAB_0154844e;
LAB_01548465:
        fVar17 = auVar32._0_4_;
      }
      uVar12 = (ulong)bVar8;
      fVar18 = (&local_a8)[uVar12].m_data[0];
      fVar22 = ((&local_a8)[uVar12].m_data[1] - fVar18) * fVar33 +
               ((&local_9c)[uVar12 - 1].m_data[2] - fVar18) * fVar17 + fVar18;
      uVar29 = 0;
      fVar18 = (&local_c8)[uVar12].m_data[0];
      fVar30 = ((&local_c8)[uVar12].m_data[1] - fVar18) * fVar33 +
               (*(float *)(local_bc + uVar12 * 0xc + -4) - fVar18) * fVar17 + fVar18;
      fVar18 = local_118[uVar12 * 3];
      fVar17 = (local_118[uVar12 * 3 + 1] - fVar18) * fVar33 +
               (local_118[uVar12 * 3 + 2] - fVar18) * fVar17 + fVar18;
      fVar33 = *(float *)((long)&local_e8 + uVar12 * 4);
      if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
        local_f8._0_4_ =
             tcu::Texture2DArrayView::sampleCompare
                       ((Texture2DArrayView *)local_d8,local_100,(params->super_RenderParams).ref,
                        fVar22,fVar30,fVar17,fVar33);
        local_f8._4_8_ = 0;
        local_f8._12_4_ = 1.0;
      }
      else {
        uVar29 = 0;
        tcu::Texture2DArrayView::sample
                  ((Texture2DArrayView *)local_f8,(Sampler *)local_d8,fVar22,fVar30,fVar17,fVar33);
      }
      tcu::operator*(local_50,(Vector<float,_4> *)local_f8,&(params->super_RenderParams).colorScale)
      ;
      VVar35 = tcu::operator+(local_40,(Vector<float,_4> *)local_50,
                              &(params->super_RenderParams).colorBias);
      auVar24._0_8_ = VVar35.m_data._8_8_;
      auVar24._8_8_ = uVar29;
      tcu::SurfaceAccess::setPixel(dst,(Vec4 *)local_40,x_00,y_00);
      auVar32 = extraout_XMM0;
    }
    y_00 = y_00 + 1;
    auVar19 = auVar32;
  } while( true );
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture2DArrayView& src, const float* texCoord, const ReferenceParams& params)
{
	tcu::Vec4 sq = tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	tcu::Vec4 tq = tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	tcu::Vec4 rq = tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	DE_ASSERT(!(params.flags & ReferenceParams::PROJECTED)); // \todo [2012-02-17 pyry] Support projected lookups.
	sampleTextureNonProjected(dst, src, sq, tq, rq, params);
}